

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::ArenaTest_MaxBlockSize_Test::~ArenaTest_MaxBlockSize_Test
          (ArenaTest_MaxBlockSize_Test *this)

{
  ArenaTest_MaxBlockSize_Test *this_local;
  
  ~ArenaTest_MaxBlockSize_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, MaxBlockSize) {
  upb_Arena* arena = upb_Arena_New();
  // Perform 600 1k allocations (600k total) and ensure that the amount of
  // memory allocated does not exceed 700k.
  for (int i = 0; i < 600; ++i) {
    upb_Arena_Malloc(arena, 1024);
  }
  EXPECT_LE(upb_Arena_SpaceAllocated(arena, nullptr), 700 * 1024);
  upb_Arena_Free(arena);
}